

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::emptydashbuffer(Forth *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_unsigned_int,_cppforth::Forth::BlockInfo> *block;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
  *__range2;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"EMPTY-BUFFERS");
  ForthStack<unsigned_int>::push(&this->dStack,0);
  __end2 = std::
           map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
           ::begin(&this->blocksInProcess);
  block = (pair<const_unsigned_int,_cppforth::Forth::BlockInfo> *)
          std::
          map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
          ::end(&this->blocksInProcess);
  while( true ) {
    bVar1 = std::operator==(&__end2,(_Self *)&block);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::
             operator*(&__end2);
    ForthStack<unsigned_int>::setTop(&this->dStack,(ppVar2->second).blockLocation);
    memFree(this);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>::operator++
              (&__end2);
  }
  ForthStack<unsigned_int>::pop(&this->dStack);
  std::
  map<unsigned_int,_cppforth::Forth::BlockInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
  ::clear(&this->blocksInProcess);
  return;
}

Assistant:

void emptydashbuffer(){
			REQUIRE_DSTACK_AVAILABLE(1, "EMPTY-BUFFERS");
			dStack.push(0);
			for (auto& block : blocksInProcess) {
				dStack.setTop(block.second.blockLocation);
				memFree();
				// we do not check error (if buffer was freed by other part of program)
			}
			dStack.pop();
			blocksInProcess.clear();
		}